

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

lys_module * ly_ctx_get_module_by(ly_ctx *ctx,char *key,int offset,char *revision,int with_disabled)

{
  lys_module *plVar1;
  int iVar2;
  LY_ERR *pLVar3;
  lys_module *plVar4;
  long lVar5;
  long lVar6;
  
  if (key == (char *)0x0 || ctx == (ly_ctx *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
  }
  else {
    lVar5 = (long)(ctx->models).used;
    if (0 < lVar5) {
      lVar6 = 0;
      plVar4 = (lys_module *)0x0;
      do {
        if ((((with_disabled != 0) || (((ctx->models).list[lVar6]->field_0x40 & 0x40) == 0)) &&
            (plVar1 = (ctx->models).list[lVar6], plVar1 != (lys_module *)0x0)) &&
           (iVar2 = strcmp(key,*(char **)((long)&plVar1->ctx + (ulong)(uint)offset)), iVar2 == 0)) {
          if (revision == (char *)0x0) {
            if ((plVar4 == (lys_module *)0x0) ||
               ((plVar1->rev_size != '\0' &&
                ((plVar4->rev_size == '\0' ||
                 (iVar2 = strcmp(plVar1->rev->date,plVar4->rev->date), -1 < iVar2)))))) {
              plVar4 = plVar1;
            }
          }
          else if ((plVar1->rev_size != '\0') &&
                  (iVar2 = strcmp(revision,plVar1->rev->date), iVar2 == 0)) {
            return plVar1;
          }
        }
        lVar6 = lVar6 + 1;
        if (lVar5 == lVar6) {
          return plVar4;
        }
      } while( true );
    }
  }
  return (lys_module *)0x0;
}

Assistant:

static const struct lys_module *
ly_ctx_get_module_by(const struct ly_ctx *ctx, const char *key, int offset, const char *revision, int with_disabled)
{
    int i;
    struct lys_module *result = NULL;

    if (!ctx || !key) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    for (i = 0; i < ctx->models.used; i++) {
        if (!with_disabled && ctx->models.list[i]->disabled) {
            /* skip the disabled modules */
            continue;
        }
        /* use offset to get address of the pointer to string (char**), remember that offset is in
         * bytes, so we have to cast the pointer to the module to (char*), finally, we want to have
         * string not the pointer to string
         */
        if (!ctx->models.list[i] || strcmp(key, *(char**)(((char*)ctx->models.list[i]) + offset))) {
            continue;
        }

        if (!revision) {
            /* compare revisons and remember the newest one */
            if (result) {
                if (!ctx->models.list[i]->rev_size) {
                    /* the current have no revision, keep the previous with some revision */
                    continue;
                }
                if (result->rev_size && strcmp(ctx->models.list[i]->rev[0].date, result->rev[0].date) < 0) {
                    /* the previous found matching module has a newer revision */
                    continue;
                }
            }

            /* remember the current match and search for newer version */
            result = ctx->models.list[i];
        } else {
            if (ctx->models.list[i]->rev_size && !strcmp(revision, ctx->models.list[i]->rev[0].date)) {
                /* matching revision */
                result = ctx->models.list[i];
                break;
            }
        }
    }

    return result;

}